

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_older
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  size_t local_50;
  size_t child_write_len;
  size_t *psStack_40;
  int ret;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  miniscript_node_t *pmStack_20;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  local_50 = *write_len;
  if (((node->child == (miniscript_node_t *)0x0) || (script_len < 0x14)) ||
     ((parent != (miniscript_node_t *)0x0 && (parent->info == (miniscript_item_t *)0x0)))) {
    node_local._4_4_ = -2;
  }
  else {
    psStack_40 = write_len;
    write_len_local = (size_t *)script_len;
    script_len_local = (size_t)script;
    script_local._4_4_ = derive_child_num;
    pmStack_20 = parent;
    parent_local = node;
    node_local._4_4_ =
         generate_script_from_miniscript
                   (node->child,node,derive_child_num,script,script_len,&local_50);
    if (node_local._4_4_ == 0) {
      if (local_50 + 1 < 0x209) {
        *(undefined1 *)(script_len_local + local_50) = 0xb2;
        *psStack_40 = local_50 + 1;
      }
      else {
        node_local._4_4_ = -2;
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_miniscript_older(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = *write_len;
    if (!node->child || (script_len < DESCRIPTOR_MIN_SIZE) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(
        node->child, node, derive_child_num, script, script_len, &child_write_len);
    if (ret != WALLY_OK)
        return ret;

    if (child_write_len + 1 > DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE)
        return WALLY_EINVAL;

    script[child_write_len] = OP_CHECKSEQUENCEVERIFY;
    *write_len = child_write_len + 1;
    return ret;
}